

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O1

void Cmd_soundlinks(FCommandLine *argv,APlayerPawn *who,int key)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  if (S_sfx.Count != 0) {
    lVar3 = 0x38;
    uVar2 = 0;
    do {
      uVar1 = (ulong)*(uint *)((long)&((S_sfx.Array)->data).data + lVar3);
      if ((uVar1 != 0xffffffff) && ((*(byte *)((long)S_sfx.Array + lVar3 + -8) & 3) == 0)) {
        Printf("%s -> %s\n",*(undefined8 *)((long)S_sfx.Array + lVar3 + -0x28),
               S_sfx.Array[uVar1].name.Chars);
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x50;
    } while (uVar2 < S_sfx.Count);
  }
  return;
}

Assistant:

CCMD (soundlinks)
{
	unsigned int i;

	for (i = 0; i < S_sfx.Size (); i++)
	{
		const sfxinfo_t *sfx = &S_sfx[i];

		if (sfx->link != sfxinfo_t::NO_LINK &&
			!sfx->bRandomHeader &&
			!sfx->bPlayerReserve)
		{
			Printf ("%s -> %s\n", sfx->name.GetChars(), S_sfx[sfx->link].name.GetChars());
		}
	}
}